

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IArrayBox.cpp
# Opt level: O1

void __thiscall amrex::IFABio::write_header(IFABio *this,ostream *os,IArrayBox *fab,int nvar)

{
  IntDescriptor *id;
  ostream *poVar1;
  char local_1a [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"IFAB ",5);
  id = FPC::NativeIntDescriptor();
  amrex::operator<<(os,id);
  poVar1 = amrex::operator<<(os,&(fab->super_BaseFab<int>).domain);
  local_1a[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,nvar);
  local_1a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a + 1,1);
  return;
}

Assistant:

void
IFABio::write_header (std::ostream& os, const IArrayBox& fab, int nvar) const
{
    AMREX_ASSERT(nvar <= fab.nComp());
    os <<"IFAB " << FPC::NativeIntDescriptor();
    os << fab.box() << ' ' << nvar << '\n';
}